

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_of_ptr(size_t n_args,uint64_t *vals)

{
  roaring64_bitmap_t *prVar1;
  roaring64_bitmap_t *r;
  
  prVar1 = roaring64_bitmap_create();
  roaring64_bitmap_add_many((roaring64_bitmap_t *)n_args,(size_t)vals,(uint64_t *)r);
  return prVar1;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_of_ptr(size_t n_args,
                                            const uint64_t *vals) {
    roaring64_bitmap_t *r = roaring64_bitmap_create();
    roaring64_bitmap_add_many(r, n_args, vals);
    return r;
}